

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

Vector<float,_16> *
deqp::gles3::Performance::arrTo16<16>
          (Vector<float,_16> *__return_storage_ptr__,Array<float,_16> *arr)

{
  float *pfVar1;
  float fVar2;
  undefined4 local_1c;
  int i;
  Array<float,_16> *arr_local;
  Vector<float,_16> *res;
  
  tcu::Vector<float,_16>::Vector(__return_storage_ptr__,0.0);
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    fVar2 = tcu::Array<float,_16>::operator[](arr,local_1c);
    pfVar1 = tcu::Vector<float,_16>::operator[](__return_storage_ptr__,local_1c);
    *pfVar1 = fVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

static tcu::Vector<float, 16> arrTo16 (const tcu::Array<float, Size>& arr)
{
	DE_STATIC_ASSERT(Size <= 16);

	tcu::Vector<float, 16> res(0.0f);

	for(int i = 0; i < Size; i++)
		res[i] = arr[i];

	return res;
}